

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void ImportModuleTypes(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  SmallArray<TypeBase_*,_32U> *this;
  ModuleData **ppMVar1;
  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this_00;
  uint alignment;
  uint uniqueId;
  ByteCode *code;
  ModuleData *pMVar2;
  Lexeme *pLVar3;
  Allocator *allocator;
  ScopeData *scope;
  long lVar4;
  IntrusiveList<MatchData> generics_00;
  InplaceStr name;
  InplaceStr name_00;
  IntrusiveList<TypeHandle> generics_01;
  SmallArray<NamespaceData_*,_128U> *this_01;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *symbols;
  ModuleData **ppMVar11;
  size_t sVar12;
  TypeBase **ppTVar13;
  TypeBase *pTVar14;
  NamespaceData **ppNVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MatchData *pMVar16;
  TypeClass *baseClass;
  SynBase *source_00;
  ParseContext *this_02;
  SynClassDefinition *definition;
  undefined4 extraout_var_04;
  TypeGenericClassProto *proto;
  TypeClass *this_03;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  DelayedType *pDVar17;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  MemberHandle *pMVar18;
  size_t sVar19;
  undefined4 extraout_var_11;
  TypeBase *pTVar20;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  ExprBase *pEVar21;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  ConstantData *node_00;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  uint uVar22;
  _func_int **pp_Var23;
  char *pcVar24;
  char *__s;
  ulong uVar25;
  uint uVar26;
  ExternTypeInfo *pEVar27;
  char *pcVar28;
  ExternTypedefInfo *pEVar29;
  longlong *plVar30;
  ulong uVar31;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  InplaceStr name_05;
  ExternConstantInfo *local_378;
  InplaceStr typeName;
  TypeClass *forwardDeclaration;
  ExternTypeInfo *local_330;
  IntrusiveList<TypeHandle> generics;
  TypeClass *local_310;
  TypeModulePair local_308;
  ExternTypedefInfo *local_2e8;
  ExternMemberInfo *local_2e0;
  HashMap<TypeClass_*> *local_2d8;
  SmallArray<NamespaceData_*,_128U> *local_2d0;
  IntrusiveList<MatchData> actualGenerics;
  TraceScope traceScope;
  SynIdentifier identifier;
  SmallArray<DelayedType,_32U> delayedTypes;
  TypeHandle *node;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_10;
  undefined4 extraout_var_15;
  undefined4 extraout_var_18;
  
  if ((ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar8 = __cxa_guard_acquire(&ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::
                                   token), iVar8 != 0)) {
    ImportModuleTypes::token = NULLC::TraceGetToken("analyze","ImportModuleTypes");
    __cxa_guard_release(&ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,ImportModuleTypes::token);
  code = moduleCtx->data->bytecode;
  symbols = FindSymbols(code);
  local_330 = FindFirstType(code);
  local_2e0 = FindFirstMember(code);
  local_378 = FindFirstConstant(code);
  local_2e8 = FindFirstTypedef(code);
  this = &moduleCtx->types;
  uVar26 = (moduleCtx->types).count;
  SmallArray<TypeBase_*,_32U>::resize(this,code->typeCount);
  memset((moduleCtx->types).data + uVar26,0,(ulong)((moduleCtx->types).count - uVar26) << 3);
  SmallArray<DelayedType,_32U>::SmallArray(&delayedTypes,ctx->allocator);
  ppMVar1 = &moduleCtx->data;
  this_00 = &ctx->internalTypeMap;
  local_2d0 = &ctx->namespaces;
  local_2d8 = &ctx->genericTypeMap;
  uVar25 = 0;
  do {
    if (code->typeCount <= uVar25) {
      uVar26 = 0;
      do {
        if (delayedTypes.count <= uVar26) {
          SmallArray<DelayedType,_32U>::~SmallArray(&delayedTypes);
          NULLC::TraceScope::~TraceScope(&traceScope);
          return;
        }
        pDVar17 = SmallArray<DelayedType,_32U>::operator[](&delayedTypes,uVar26);
        uVar22 = pDVar17->index;
        if (local_330[uVar22].subCat == CAT_CLASS) {
          pEVar27 = local_330 + uVar22;
          pcVar24 = symbols + pEVar27->offsetToName;
          sVar12 = strlen(pcVar24);
          pTVar14 = GetImportedModuleTypeAt(ctx,source,moduleCtx,uVar22);
          if (pTVar14 != (TypeBase *)0x0) {
            uVar22 = pTVar14->typeID;
            if ((uVar22 < 0x1a) && ((0x3130000U >> (uVar22 & 0x1f) & 1) != 0)) {
              ExpressionContext::PushScope(ctx,pTVar14);
              pTVar14[1]._vptr_TypeBase = (_func_int **)ctx->scope;
              if ((pTVar14->typeID == 0x18) && (*(char *)&pTVar14[2].arrayTypes.tail == '\x01')) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
                allocator = ctx->allocator;
                scope = ctx->scope;
                pTVar20 = ctx->typeTypeID;
                iVar9 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
                name_02.end = "";
                name_02.begin = "$typeid";
                SynIdentifier::SynIdentifier
                          ((SynIdentifier *)CONCAT44(extraout_var_09,iVar9),name_02);
                uVar22 = ctx->uniqueVariableId;
                ctx->uniqueVariableId = uVar22 + 1;
                VariableData::VariableData
                          ((VariableData *)CONCAT44(extraout_var_08,iVar8),allocator,source,scope,0,
                           pTVar20,(SynIdentifier *)CONCAT44(extraout_var_09,iVar9),0,uVar22);
                iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
                pMVar18 = (MemberHandle *)CONCAT44(extraout_var_10,iVar9);
                pMVar18->source = source;
                pMVar18->variable = (VariableData *)CONCAT44(extraout_var_08,iVar8);
                pMVar18->initializer = (SynBase *)0x0;
                pMVar18->next = (MemberHandle *)0x0;
                pMVar18->listed = false;
                IntrusiveList<MemberHandle>::push_back
                          ((IntrusiveList<MemberHandle> *)&pTVar14[1].typeID,pMVar18);
              }
              pcVar28 = pcVar24 + sVar12;
              for (uVar22 = 0; __s = pcVar28 + 1, uVar22 < (pEVar27->field_8).arrSize;
                  uVar22 = uVar22 + 1) {
                sVar19 = strlen(__s);
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
                pcVar28 = __s + sVar19;
                name_03.end = pcVar28;
                name_03.begin = __s;
                SynIdentifier::SynIdentifier
                          ((SynIdentifier *)CONCAT44(extraout_var_11,iVar8),name_03);
                uVar10 = (pEVar27->field_11).subType + uVar22;
                pTVar20 = GetImportedModuleTypeAt(ctx,source,moduleCtx,local_2e0[uVar10].type);
                if (pTVar20 == (TypeBase *)0x0) {
                  iVar8 = (int)((*ppMVar1)->name).begin;
                  anon_unknown.dwarf_ff84f::Stop
                            (ctx,source,
                             "ERROR: can\'t find member %d type for \'%s\' in module %.*s",
                             (ulong)(uVar22 + 1),symbols + pEVar27->offsetToName,
                             (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - iVar8),iVar8);
                }
                iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
                alignment = local_2e0[uVar10].alignment;
                uVar10 = local_2e0[uVar10].offset;
                uniqueId = ctx->uniqueVariableId;
                ctx->uniqueVariableId = uniqueId + 1;
                VariableData::VariableData
                          ((VariableData *)CONCAT44(extraout_var_12,iVar9),ctx->allocator,source,
                           ctx->scope,alignment,pTVar20,
                           (SynIdentifier *)CONCAT44(extraout_var_11,iVar8),uVar10,uniqueId);
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
                pMVar18 = (MemberHandle *)CONCAT44(extraout_var_13,iVar8);
                pMVar18->source = source;
                pMVar18->variable = (VariableData *)CONCAT44(extraout_var_12,iVar9);
                pMVar18->initializer = (SynBase *)0x0;
                pMVar18->next = (MemberHandle *)0x0;
                pMVar18->listed = false;
                IntrusiveList<MemberHandle>::push_back
                          ((IntrusiveList<MemberHandle> *)&pTVar14[1].typeID,pMVar18);
              }
              plVar30 = &pDVar17->constants->value;
              for (uVar25 = 1; (int)uVar25 - 1U < pEVar27->constantCount;
                  uVar25 = (ulong)((int)uVar25 + 1)) {
                sVar19 = strlen(__s);
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
                name_04.end = __s + sVar19;
                name_04.begin = __s;
                SynIdentifier::SynIdentifier
                          ((SynIdentifier *)CONCAT44(extraout_var_14,iVar8),name_04);
                pTVar20 = GetImportedModuleTypeAt
                                    (ctx,source,moduleCtx,
                                     ((ExternConstantInfo *)((long)plVar30 + -4))->type);
                if (pTVar20 == (TypeBase *)0x0) {
                  iVar8 = (int)((*ppMVar1)->name).begin;
                  anon_unknown.dwarf_ff84f::Stop
                            (ctx,source,
                             "ERROR: can\'t find constant %d type for \'%s\' in module %.*s",uVar25,
                             symbols + pEVar27->offsetToName,
                             (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - iVar8),iVar8);
                }
                if (pTVar20 == ctx->typeBool) {
                  iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                  pEVar21 = (ExprBase *)CONCAT44(extraout_var_16,iVar9);
                  lVar4 = *plVar30;
                  pEVar21->typeID = 3;
                  pEVar21->source = source;
                  pEVar21->type = pTVar20;
                  pEVar21->listed = false;
                  pEVar21->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3360;
                  pEVar21->field_0x29 = lVar4 != 0;
                  pEVar21->next = (ExprBase *)0x0;
                }
                else {
                  bVar7 = ExpressionContext::IsIntegerType(ctx,pTVar20);
                  if ((bVar7) || (pTVar20->typeID == 0x19)) {
                    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                    pEVar21 = (ExprBase *)CONCAT44(extraout_var_15,iVar9);
                    pp_Var23 = (_func_int **)*plVar30;
                    pEVar21->typeID = 6;
                    pEVar21->source = source;
                    pEVar21->type = pTVar20;
                    pEVar21->next = (ExprBase *)0x0;
                    pEVar21->listed = false;
                    pEVar21->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e33d0;
                    pEVar21[1]._vptr_ExprBase = pp_Var23;
                  }
                  else {
                    if ((ctx->typeFloat != pTVar20) && (ctx->typeDouble != pTVar20)) {
                      anon_unknown.dwarf_ff84f::Stop
                                (ctx,source,"ERROR: can\'t import constant %d of type \'%.*s\'",
                                 uVar25,(ulong)(uint)(*(int *)&(pTVar20->name).end -
                                                     (int)(pTVar20->name).begin));
                    }
                    pp_Var23 = (_func_int **)*plVar30;
                    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                    pEVar21 = (ExprBase *)CONCAT44(extraout_var_17,iVar9);
                    pEVar21->typeID = 7;
                    pEVar21->source = source;
                    pEVar21->type = pTVar20;
                    pEVar21->next = (ExprBase *)0x0;
                    pEVar21->listed = false;
                    pEVar21->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3408;
                    pEVar21[1]._vptr_ExprBase = pp_Var23;
                  }
                }
                iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                node_00 = (ConstantData *)CONCAT44(extraout_var_18,iVar9);
                __s = __s + sVar19 + 1;
                node_00->name = (SynIdentifier *)CONCAT44(extraout_var_14,iVar8);
                node_00->value = pEVar21;
                node_00->next = (ConstantData *)0x0;
                node_00->listed = false;
                IntrusiveList<ConstantData>::push_back
                          ((IntrusiveList<ConstantData> *)&pTVar14[1].name.end,node_00);
                plVar30 = (longlong *)((long)plVar30 + 0xc);
              }
              ExpressionContext::PopScope(ctx,SCOPE_TYPE);
              uVar22 = pTVar14->typeID;
            }
            if (uVar22 == 0x18) {
              identifier.super_SynBase._vptr_SynBase = (_func_int **)0x0;
              identifier.super_SynBase.typeID = 0;
              identifier.super_SynBase._12_4_ = 0;
              uVar22 = 0;
              pEVar29 = local_2e8;
              for (uVar25 = 0; uVar25 < code->typedefCount; uVar25 = uVar25 + 1) {
                if (pEVar29->parentType == pDVar17->index) {
                  pcVar28 = symbols + pEVar29->offsetToName;
                  sVar19 = strlen(pcVar28);
                  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
                  name_05.end = pcVar28 + sVar19;
                  name_05.begin = pcVar28;
                  SynIdentifier::SynIdentifier
                            ((SynIdentifier *)CONCAT44(extraout_var_19,iVar8),name_05);
                  pTVar20 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar29->targetType);
                  if (pTVar20 == (TypeBase *)0x0) {
                    iVar8 = (int)((*ppMVar1)->name).begin;
                    anon_unknown.dwarf_ff84f::Stop
                              (ctx,source,
                               "ERROR: can\'t find type \'%.*s\' alias \'%s\' target type in module %.*s"
                               ,sVar12,pcVar24,symbols + pEVar29->offsetToName,
                               *(int *)&((*ppMVar1)->name).end - iVar8,iVar8);
                  }
                  if (uVar22 < pEVar27->genericTypeCount) {
                    uVar22 = uVar22 + 1;
                  }
                  else {
                    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                    pMVar16 = (MatchData *)CONCAT44(extraout_var_20,iVar9);
                    pMVar16->name = (SynIdentifier *)CONCAT44(extraout_var_19,iVar8);
                    pMVar16->type = pTVar20;
                    pMVar16->next = (MatchData *)0x0;
                    pMVar16->listed = false;
                    IntrusiveList<MatchData>::push_back
                              ((IntrusiveList<MatchData> *)&identifier,pMVar16);
                  }
                }
                pEVar29 = pEVar29 + 1;
              }
              pTVar14[2].refType = (TypeRef *)identifier.super_SynBase._vptr_SynBase;
              pTVar14[2].arrayTypes.head = (TypeHandle *)identifier.super_SynBase._8_8_;
            }
          }
        }
        uVar26 = uVar26 + 1;
      } while( true );
    }
    ppMVar11 = ppMVar1;
    if (local_330[uVar25].definitionModule != 0) {
      ppMVar11 = SmallArray<ModuleData_*,_32U>::operator[]
                           (&moduleCtx->dependencies,local_330[uVar25].definitionModule - 1);
    }
    pEVar27 = local_330 + uVar25;
    pMVar2 = *ppMVar11;
    uVar26 = (uint)uVar25;
    if ((pEVar27->typeFlags & 8) == 0) {
LAB_001e0fbf:
      if (CAT_FUNCTION < pEVar27->subCat) {
        if (pEVar27->subCat != CAT_CLASS) {
          pcVar24 = ((*ppMVar1)->name).begin;
          anon_unknown.dwarf_ff84f::Stop
                    (ctx,source,"ERROR: new type in module %.*s named %s unsupported",
                     (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - (int)pcVar24),pcVar24,
                     symbols + pEVar27->offsetToName);
        }
        forwardDeclaration = (TypeClass *)0x0;
        pTVar14 = CheckPreviousTypeDefinition
                            (ctx,source,moduleCtx,symbols,pEVar27,&forwardDeclaration);
        if (pTVar14 == (TypeBase *)0x0) {
          pcVar24 = symbols + pEVar27->offsetToName;
          typeName.begin = pcVar24;
          sVar12 = strlen(pcVar24);
          this_01 = local_2d0;
          typeName.end = pcVar24 + sVar12;
          uVar22 = 0;
          while( true ) {
            bVar7 = true;
            if ((ctx->namespaces).count <= uVar22) break;
            ppNVar15 = SmallArray<NamespaceData_*,_128U>::operator[](this_01,uVar22);
            if ((*ppNVar15)->fullNameHash == pEVar27->namespaceHash) {
              ppNVar15 = SmallArray<NamespaceData_*,_128U>::operator[](this_01,uVar22);
              bVar7 = true;
              if (*ppNVar15 != (NamespaceData *)0x0) {
                ExpressionContext::PushScope(ctx,*ppNVar15);
                bVar7 = false;
              }
              break;
            }
            uVar22 = uVar22 + 1;
          }
          generics.head = (TypeHandle *)0x0;
          generics.tail = (TypeHandle *)0x0;
          actualGenerics.head = (MatchData *)0x0;
          actualGenerics.tail = (MatchData *)0x0;
          bVar5 = 0;
          pEVar29 = local_2e8;
          for (uVar31 = 0; uVar31 < code->typedefCount; uVar31 = uVar31 + 1) {
            if (uVar25 == pEVar29->parentType) {
              uVar22 = IntrusiveList<TypeHandle>::size(&generics);
              if (uVar22 < pEVar27->genericTypeCount) {
                pcVar24 = symbols + pEVar29->offsetToName;
                sVar12 = strlen(pcVar24);
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
                name_01.end = pcVar24 + sVar12;
                name_01.begin = pcVar24;
                SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar8),name_01);
                pTVar14 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar29->targetType);
                if (pTVar14 == (TypeBase *)0x0) {
                  iVar8 = (int)((*ppMVar1)->name).begin;
                  anon_unknown.dwarf_ff84f::Stop
                            (ctx,source,
                             "ERROR: can\'t find type \'%.*s\' alias \'%s\' target type in module %.*s"
                             ,(ulong)(uint)((int)typeName.end - (int)typeName.begin),typeName.begin,
                             symbols + pEVar29->offsetToName,*(int *)&((*ppMVar1)->name).end - iVar8
                             ,iVar8);
                }
                bVar5 = bVar5 | pTVar14->isGeneric;
                iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
                node = (TypeHandle *)CONCAT44(extraout_var_00,iVar9);
                node->type = pTVar14;
                node->next = (TypeHandle *)0x0;
                node->listed = false;
                IntrusiveList<TypeHandle>::push_back(&generics,node);
                iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                pMVar16 = (MatchData *)CONCAT44(extraout_var_01,iVar9);
                pMVar16->name = (SynIdentifier *)CONCAT44(extraout_var,iVar8);
                pMVar16->type = pTVar14;
                pMVar16->next = (MatchData *)0x0;
                pMVar16->listed = false;
                IntrusiveList<MatchData>::push_back(&actualGenerics,pMVar16);
              }
            }
            pEVar29 = pEVar29 + 1;
          }
          if (pEVar27->baseType == 0) {
            baseClass = (TypeClass *)0x0;
          }
          else {
            baseClass = (TypeClass *)GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar27->baseType)
            ;
            if ((baseClass == (TypeClass *)0x0) ||
               ((baseClass->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
              iVar8 = (int)((*ppMVar1)->name).begin;
              anon_unknown.dwarf_ff84f::Stop
                        (ctx,source,"ERROR: can\'t find type \'%.*s\' base type in module %.*s",
                         (ulong)(uint)((int)typeName.end - (int)typeName.begin),typeName.begin,
                         (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - iVar8),iVar8);
            }
          }
          uVar22 = pMVar2->lexStreamSize;
          if (uVar22 <= pEVar27->definitionLocationStart) {
            __assert_fail("type.definitionLocationStart < importModule->lexStreamSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x30ef,
                          "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)")
            ;
          }
          if (uVar22 <= pEVar27->definitionLocationEnd) {
            __assert_fail("type.definitionLocationEnd < importModule->lexStreamSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x30f0,
                          "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)")
            ;
          }
          source_00 = source;
          pcVar24 = typeName.end;
          if (pEVar27->definitionLocationEnd != 0 || pEVar27->definitionLocationStart != 0) {
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            source_00 = (SynBase *)CONCAT44(extraout_var_02,iVar8);
            SynImportLocation::SynImportLocation
                      ((SynImportLocation *)source_00,
                       pMVar2->lexStream + pEVar27->definitionLocationStart,
                       pMVar2->lexStream + pEVar27->definitionLocationEnd);
            uVar22 = pMVar2->lexStreamSize;
            pcVar24 = typeName.end;
          }
          typeName.end._4_4_ = (undefined4)((ulong)pcVar24 >> 0x20);
          typeName.end._0_4_ = (int)pcVar24;
          uVar10 = pEVar27->definitionLocationName;
          typeName.end = pcVar24;
          if (uVar22 <= uVar10) {
            __assert_fail("type.definitionLocationName < importModule->lexStreamSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x30f4,
                          "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)")
            ;
          }
          if ((ulong)uVar10 == 0) {
            name_00.end._0_4_ = (int)typeName.end;
            name_00.begin = typeName.begin;
            name_00.end._4_4_ = typeName.end._4_4_;
            SynIdentifier::SynIdentifier(&identifier,name_00);
          }
          else {
            name.end._0_4_ = (int)typeName.end;
            name.begin = typeName.begin;
            name.end._4_4_ = typeName.end._4_4_;
            SynIdentifier::SynIdentifier
                      (&identifier,pMVar2->lexStream + uVar10,pMVar2->lexStream + uVar10,name);
          }
          if ((int)pEVar27->definitionOffset < -1) {
            if (forwardDeclaration != (TypeClass *)0x0) {
              __assert_fail("!forwardDeclaration",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x30fe,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            proto = (TypeGenericClassProto *)
                    GetImportedModuleTypeAt
                              (ctx,source,moduleCtx,pEVar27->definitionOffset & 0x7fffffff);
            if (proto == (TypeGenericClassProto *)0x0) {
              anon_unknown.dwarf_ff84f::Stop
                        (ctx,source,"ERROR: can\'t find proto type for \'%s\' in module %.*s",
                         symbols + pEVar27->offsetToName,
                         (ulong)(uint)(*(int *)&((*ppMVar1)->name).end -
                                      (int)((*ppMVar1)->name).begin));
            }
            if ((proto->super_TypeBase).typeID != 0x16) {
              anon_unknown.dwarf_ff84f::Stop
                        (ctx,source,
                         "ERROR: can\'t find correct proto type for \'%s\' in module %.*s",
                         symbols + pEVar27->offsetToName,
                         (ulong)(uint)(*(int *)&((*ppMVar1)->name).end -
                                      (int)((*ppMVar1)->name).begin));
            }
            if ((bVar5 & 1) == 0) {
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
              this_03 = (TypeClass *)CONCAT44(extraout_var_05,iVar8);
              generics_00.tail._0_4_ = (int)actualGenerics.tail;
              generics_00.head = actualGenerics.head;
              generics_00.tail._4_4_ = (int)((ulong)actualGenerics.tail >> 0x20);
              TypeClass::TypeClass
                        (this_03,ctx->allocator,&identifier,source_00,ctx->scope,proto,generics_00,
                         (bool)((pEVar27->typeFlags & 4) >> 2),baseClass);
              bVar5 = pEVar27->typeFlags;
              if ((bVar5 & 0x10) != 0) {
                this_03->completed = true;
              }
              if ((bVar5 & 8) != 0) {
                this_03->isInternal = true;
                local_308.typeName.end = typeName.end;
                local_308.typeName.begin = typeName.begin;
                local_310 = this_03;
                local_308.importModule = pMVar2;
                SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
                          (this_00,&local_308,(TypeBase **)&local_310);
              }
              ExpressionContext::AddType(ctx,(TypeBase *)this_03);
              uVar22 = pEVar27->genericTypeCount;
              uVar10 = IntrusiveList<TypeHandle>::size(&generics);
              if (uVar22 != uVar10) {
                __assert_fail("type.genericTypeCount == generics.size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x3122,
                              "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                             );
              }
              if (generics.head != (TypeHandle *)0x0) {
                uVar22 = InplaceStr::hash(&typeName);
                HashMap<TypeClass_*>::insert(local_2d8,uVar22,this_03);
              }
            }
            else {
              generics_01.tail = generics.tail;
              generics_01.head = generics.head;
              this_03 = (TypeClass *)
                        ExpressionContext::GetGenericClassType(ctx,source,proto,generics_01);
            }
          }
          else {
            uVar22 = pEVar27->definitionOffsetStart;
            if ((ulong)uVar22 == 0xffffffff) {
              if (pEVar27->type == TYPE_COMPLEX) {
                if (forwardDeclaration == (TypeClass *)0x0) {
                  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
                  this_03 = (TypeClass *)CONCAT44(extraout_var_07,iVar8);
                  TypeClass::TypeClass
                            (this_03,ctx->allocator,&identifier,source_00,ctx->scope,
                             (TypeGenericClassProto *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),
                             (bool)((pEVar27->typeFlags & 4) >> 2),baseClass);
                  bVar5 = pEVar27->typeFlags;
                }
                else {
                  forwardDeclaration->source = source_00;
                  (forwardDeclaration->identifier).super_SynBase.listed =
                       identifier.super_SynBase.listed;
                  (forwardDeclaration->identifier).super_SynBase.isInternal =
                       identifier.super_SynBase.isInternal;
                  (forwardDeclaration->identifier).super_SynBase.pos.end =
                       identifier.super_SynBase.pos.end;
                  (forwardDeclaration->identifier).super_SynBase.next =
                       identifier.super_SynBase.next;
                  (forwardDeclaration->identifier).super_SynBase.end = identifier.super_SynBase.end;
                  (forwardDeclaration->identifier).super_SynBase.pos.begin =
                       identifier.super_SynBase.pos.begin;
                  (forwardDeclaration->identifier).super_SynBase.typeID =
                       identifier.super_SynBase.typeID;
                  *(undefined4 *)&(forwardDeclaration->identifier).super_SynBase.field_0xc =
                       identifier.super_SynBase._12_4_;
                  (forwardDeclaration->identifier).super_SynBase.begin =
                       identifier.super_SynBase.begin;
                  (forwardDeclaration->identifier).name.begin = identifier.name.begin;
                  (forwardDeclaration->identifier).name.end = identifier.name.end;
                  forwardDeclaration->scope = ctx->scope;
                  bVar5 = pEVar27->typeFlags;
                  forwardDeclaration->extendable = (bool)(bVar5 >> 2 & 1);
                  forwardDeclaration->baseClass = baseClass;
                  this_03 = forwardDeclaration;
                }
                if ((bVar5 & 0x10) != 0) {
                  this_03->completed = true;
                }
                if ((bVar5 & 8) != 0) {
                  this_03->isInternal = true;
                  local_308.typeName.begin = typeName.begin;
                  local_310 = this_03;
                  local_308.typeName.end = typeName.end;
                  local_308.importModule = pMVar2;
                  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
                            (this_00,&local_308,(TypeBase **)&local_310);
                }
                if (forwardDeclaration == (TypeClass *)0x0) {
                  ExpressionContext::AddType(ctx,(TypeBase *)this_03);
                }
              }
              else {
                if (forwardDeclaration != (TypeClass *)0x0) {
                  __assert_fail("!forwardDeclaration",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x3144,
                                "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                               );
                }
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xe8);
                this_03 = (TypeClass *)CONCAT44(extraout_var_06,iVar8);
                TypeEnum::TypeEnum((TypeEnum *)this_03,&identifier,source_00,ctx->scope);
                ExpressionContext::AddType(ctx,(TypeBase *)this_03);
                if (generics.head != (TypeHandle *)0x0) {
                  __assert_fail("generics.empty()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x314c,
                                "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                               );
                }
              }
            }
            else {
              if (forwardDeclaration != (TypeClass *)0x0) {
                __assert_fail("!forwardDeclaration",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x312a,
                              "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                             );
              }
              if (pMVar2->lexStreamSize <= uVar22) {
                __assert_fail("type.definitionOffsetStart < importModule->lexStreamSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x312c,
                              "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                             );
              }
              pLVar3 = pMVar2->lexStream;
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x1640);
              this_02 = (ParseContext *)CONCAT44(extraout_var_03,iVar8);
              ParseContext::ParseContext
                        (this_02,ctx->allocator,ctx->optimizationLevel,
                         (ArrayView<InplaceStr>)ZEXT816(0));
              this_02->currentLexeme = pLVar3 + uVar22;
              ImportModuleNamespaces(this_02,pLVar3 + uVar22,pMVar2->bytecode);
              definition = (SynClassDefinition *)ParseClassDefinition(this_02);
              if ((definition == (SynClassDefinition *)0x0) ||
                 ((definition->super_SynBase).typeID != 0x3f)) {
                anon_unknown.dwarf_ff84f::Stop
                          (ctx,source,"ERROR: failed to import generic class body");
              }
              (definition->super_SynBase).field_0x3a = 1;
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
              this_03 = (TypeClass *)CONCAT44(extraout_var_04,iVar8);
              TypeGenericClassProto::TypeGenericClassProto
                        ((TypeGenericClassProto *)this_03,&identifier,source_00,ctx->scope,
                         definition);
              ExpressionContext::AddType(ctx,(TypeBase *)this_03);
            }
          }
          ppTVar13 = SmallArray<TypeBase_*,_32U>::operator[](this,uVar26);
          *ppTVar13 = (TypeBase *)this_03;
          ppTVar13 = SmallArray<TypeBase_*,_32U>::operator[](this,uVar26);
          (*ppTVar13)->importModule = pMVar2;
          ppTVar13 = SmallArray<TypeBase_*,_32U>::operator[](this,uVar26);
          bVar6 = InplaceStr::operator==(&(*ppTVar13)->name,&typeName);
          if (!bVar6) {
            __assert_fail("moduleCtx.types[i]->name == typeName",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x3177,
                          "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)")
            ;
          }
          (this_03->super_TypeStruct).super_TypeBase.alignment = (uint)pEVar27->defaultAlign;
          (this_03->super_TypeStruct).super_TypeBase.size = (ulong)pEVar27->size;
          (this_03->super_TypeStruct).super_TypeBase.hasPointers = pEVar27->pointerCount != 0;
          uVar22 = (this_03->super_TypeStruct).super_TypeBase.typeID;
          if ((uVar22 < 0x1a) && ((0x3130000U >> (uVar22 & 0x1f) & 1) != 0)) {
            local_308.typeName.begin = (char *)CONCAT44(local_308.typeName.begin._4_4_,uVar26);
            local_308.typeName.end = (char *)local_378;
            SmallArray<DelayedType,_32U>::push_back(&delayedTypes,(DelayedType *)&local_308);
            local_378 = local_378 + pEVar27->constantCount;
            uVar22 = (this_03->super_TypeStruct).super_TypeBase.typeID;
          }
          if (uVar22 == 0x18) {
            this_03->hasFinalizer = (bool)(pEVar27->typeFlags & 1);
          }
          if (!bVar7) {
            ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE);
          }
        }
        else {
          ppTVar13 = SmallArray<TypeBase_*,_32U>::operator[](this,uVar26);
          *ppTVar13 = pTVar14;
          local_378 = local_378 + pEVar27->constantCount;
        }
      }
    }
    else {
      pp_Var23 = (_func_int **)(symbols + pEVar27->offsetToName);
      sVar12 = strlen((char *)pp_Var23);
      identifier.super_SynBase._8_8_ = sVar12 + (long)pp_Var23;
      identifier.super_SynBase._vptr_SynBase = pp_Var23;
      identifier.super_SynBase.begin = (Lexeme *)pMVar2;
      ppTVar13 = SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::find
                           (this_00,(TypeModulePair *)&identifier);
      if (ppTVar13 == (TypeBase **)0x0) goto LAB_001e0fbf;
      pTVar14 = *ppTVar13;
      ppTVar13 = SmallArray<TypeBase_*,_32U>::operator[](this,uVar26);
      *ppTVar13 = pTVar14;
      local_378 = local_378 + pEVar27->constantCount;
    }
    uVar25 = uVar25 + 1;
  } while( true );
}

Assistant:

void ImportModuleTypes(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleTypes");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import types
	ExternTypeInfo *typeList = FindFirstType(bCode);
	ExternMemberInfo *memberList = FindFirstMember(bCode);
	ExternConstantInfo *constantList = FindFirstConstant(bCode);
	ExternTypedefInfo *aliasList = FindFirstTypedef(bCode);

	unsigned prevSize = moduleCtx.types.size();

	moduleCtx.types.resize(bCode->typeCount);

	memset(moduleCtx.types.data + prevSize, 0, (moduleCtx.types.size() - prevSize) * sizeof(moduleCtx.types.data[0]));

	SmallArray<DelayedType, 32> delayedTypes(ctx.allocator);

	ExternConstantInfo *currentConstant = constantList;

	for(unsigned i = 0; i < bCode->typeCount; i++)
	{
		ExternTypeInfo &type = typeList[i];

		ModuleData *importModule = moduleCtx.data;

		if(type.definitionModule != 0)
			importModule = moduleCtx.dependencies[type.definitionModule - 1];

		// Skip internal types if we already imported that module
		if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
		{
			InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

			if(TypeBase **prev = ctx.internalTypeMap.find(TypeModulePair(typeName, importModule)))
			{
				moduleCtx.types[i] = *prev;

				currentConstant += type.constantCount;
				continue;
			}
		}

		switch(type.subCat)
		{
		case ExternTypeInfo::CAT_NONE:
		case ExternTypeInfo::CAT_ARRAY:
		case ExternTypeInfo::CAT_POINTER:
		case ExternTypeInfo::CAT_FUNCTION:
			break;
		case ExternTypeInfo::CAT_CLASS:
			{
				TypeClass *forwardDeclaration = NULL;

				// Skip existing types
				if(TypeBase *prevType = CheckPreviousTypeDefinition(ctx, source, moduleCtx, symbols, type, &forwardDeclaration))
				{
					moduleCtx.types[i] = prevType;

					currentConstant += type.constantCount;
					break;
				}

				InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

				NamespaceData *parentNamespace = NULL;

				for(unsigned k = 0; k < ctx.namespaces.size(); k++)
				{
					if(ctx.namespaces[k]->fullNameHash == type.namespaceHash)
					{
						parentNamespace = ctx.namespaces[k];
						break;
					}
				}

				if(parentNamespace)
					ctx.PushScope(parentNamespace);

				// Find all generics for this type
				bool isGeneric = false;

				IntrusiveList<TypeHandle> generics;
				IntrusiveList<MatchData> actualGenerics;

				for(unsigned k = 0; k < bCode->typedefCount; k++)
				{
					ExternTypedefInfo &alias = aliasList[k];

					if(alias.parentType == i && generics.size() < type.genericTypeCount)
					{
						InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

						SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

						TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

						if(!targetType)
							Stop(ctx, source, "ERROR: can't find type '%.*s' alias '%s' target type in module %.*s", FMT_ISTR(typeName), symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

						isGeneric |= targetType->isGeneric;

						generics.push_back(new (ctx.get<TypeHandle>()) TypeHandle(targetType));
						actualGenerics.push_back(new (ctx.get<MatchData>()) MatchData(aliasNameIdentifier, targetType));
					}
				}

				TypeClass *baseType = NULL;

				if(type.baseType)
				{
					baseType = getType<TypeClass>(GetImportedModuleTypeAt(ctx, source, moduleCtx, type.baseType));

					if(!baseType)
						Stop(ctx, source, "ERROR: can't find type '%.*s' base type in module %.*s", FMT_ISTR(typeName), FMT_ISTR(moduleCtx.data->name));
				}

				assert(type.definitionLocationStart < importModule->lexStreamSize);
				assert(type.definitionLocationEnd < importModule->lexStreamSize);
				
				SynBase *locationSource = type.definitionLocationStart != 0 || type.definitionLocationEnd != 0 ? new (ctx.get<SynImportLocation>()) SynImportLocation(type.definitionLocationStart + importModule->lexStream, type.definitionLocationEnd + importModule->lexStream) : source;

				assert(type.definitionLocationName < importModule->lexStreamSize);

				Lexeme *locationName = type.definitionLocationName + importModule->lexStream;

				SynIdentifier identifier = type.definitionLocationName != 0 ? SynIdentifier(locationName, locationName, typeName) : SynIdentifier(typeName);

				TypeBase *importedType = NULL;

				if(type.definitionOffset != ~0u && type.definitionOffset & 0x80000000)
				{
					assert(!forwardDeclaration);

					TypeBase *proto = GetImportedModuleTypeAt(ctx, source, moduleCtx, type.definitionOffset & ~0x80000000);

					if(!proto)
						Stop(ctx, source, "ERROR: can't find proto type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

					TypeGenericClassProto *protoClass = getType<TypeGenericClassProto>(proto);

					if(!protoClass)
						Stop(ctx, source, "ERROR: can't find correct proto type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

					if(isGeneric)
					{
						importedType = ctx.GetGenericClassType(source, protoClass, generics);

						// TODO: assert that alias list is empty and that correct number of generics was exported
					}
					else
					{
						TypeClass *classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, identifier, locationSource, ctx.scope, protoClass, actualGenerics, (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0, baseType);

						if(type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED)
							classType->completed = true;

						if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
						{
							classType->isInternal = true;

							ctx.internalTypeMap.insert(TypeModulePair(typeName, importModule), classType);
						}

						importedType = classType;

						ctx.AddType(importedType);

						assert(type.genericTypeCount == generics.size());

						if(!generics.empty())
							ctx.genericTypeMap.insert(typeName.hash(), classType);
					}
				}
				else if(type.definitionOffsetStart != ~0u)
				{
					assert(!forwardDeclaration);

					assert(type.definitionOffsetStart < importModule->lexStreamSize);
					Lexeme *start = type.definitionOffsetStart + importModule->lexStream;

					ParseContext *parser = new (ctx.get<ParseContext>()) ParseContext(ctx.allocator, ctx.optimizationLevel, ArrayView<InplaceStr>());

					parser->currentLexeme = start;

					ImportModuleNamespaces(*parser, start, importModule->bytecode);

					SynClassDefinition *definition = getType<SynClassDefinition>(ParseClassDefinition(*parser));

					if(!definition)
						Stop(ctx, source, "ERROR: failed to import generic class body");

					definition->imported = true;

					importedType = new (ctx.get<TypeGenericClassProto>()) TypeGenericClassProto(identifier, locationSource, ctx.scope, definition);

					ctx.AddType(importedType);

					// TODO: check that type doesn't have generics or aliases
				}
				else if(type.type != ExternTypeInfo::TYPE_COMPLEX)
				{
					assert(!forwardDeclaration);

					TypeEnum *enumType = new (ctx.get<TypeEnum>()) TypeEnum(identifier, locationSource, ctx.scope);

					importedType = enumType;

					ctx.AddType(importedType);

					assert(generics.empty());
				}
				else
				{
					IntrusiveList<MatchData> actualGenerics;

					TypeClass *classType = NULL;

					if(forwardDeclaration)
					{
						classType = forwardDeclaration;

						classType->source = locationSource;
						classType->identifier = identifier;
						classType->scope = ctx.scope;
						classType->extendable = (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0;
						classType->baseClass = baseType;
					}
					else
					{
						classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, identifier, locationSource, ctx.scope, NULL, actualGenerics, (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0, baseType);
					}

					if(type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED)
						classType->completed = true;

					if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
					{
						classType->isInternal = true;

						ctx.internalTypeMap.insert(TypeModulePair(typeName, importModule), classType);
					}

					importedType = classType;

					if(!forwardDeclaration)
						ctx.AddType(importedType);
				}

				moduleCtx.types[i] = importedType;

				moduleCtx.types[i]->importModule = importModule;

				assert(moduleCtx.types[i]->name == typeName);

				importedType->alignment = type.defaultAlign;
				importedType->size = type.size;

				importedType->hasPointers = type.pointerCount != 0;

				if(getType<TypeStruct>(importedType))
				{
					delayedTypes.push_back(DelayedType(i, currentConstant));

					currentConstant += type.constantCount;
				}

				if(TypeClass *classType = getType<TypeClass>(importedType))
					classType->hasFinalizer = type.typeFlags & ExternTypeInfo::TYPE_HAS_FINALIZER;

				if(parentNamespace)
					ctx.PopScope(SCOPE_NAMESPACE);
			}
			break;
		default:
			Stop(ctx, source, "ERROR: new type in module %.*s named %s unsupported", FMT_ISTR(moduleCtx.data->name), symbols + type.offsetToName);
		}
	}

	for(unsigned i = 0; i < delayedTypes.size(); i++)
	{
		DelayedType &delayedType = delayedTypes[i];
		ExternTypeInfo &type = typeList[delayedType.index];

		switch(type.subCat)
		{
		case ExternTypeInfo::CAT_CLASS:
			{
				InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

				TypeBase *importedType = GetImportedModuleTypeAt(ctx, source, moduleCtx, delayedType.index);

				const char *memberNames = typeName.end + 1;

				if(TypeStruct *structType = getType<TypeStruct>(importedType))
				{
					ctx.PushScope(importedType);

					structType->typeScope = ctx.scope;

					if(TypeClass *typeClass = getType<TypeClass>(structType))
					{
						if(typeClass->extendable)
						{
							// TODO: apart from LLVM failure, were there any issues with this member missing?
							VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, ctx.typeTypeID, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$typeid")), 0, ctx.uniqueVariableId++);

							structType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(source, member, NULL));
						}
					}

					for(unsigned n = 0; n < type.memberCount; n++)
					{
						InplaceStr memberName = InplaceStr(memberNames);

						SynIdentifier *memberNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(memberName);

						memberNames = memberName.end + 1;

						ExternMemberInfo &memberInfo = memberList[type.memberOffset + n];

						TypeBase *memberType = GetImportedModuleTypeAt(ctx, source, moduleCtx, memberInfo.type);

						if(!memberType)
							Stop(ctx, source, "ERROR: can't find member %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

						VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, memberInfo.alignment, memberType, memberNameIdentifier, memberInfo.offset, ctx.uniqueVariableId++);

						structType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(source, member, NULL));
					}

					ExternConstantInfo *constantInfo = delayedType.constants;

					for(unsigned int n = 0; n < type.constantCount; n++)
					{
						InplaceStr memberName = InplaceStr(memberNames);

						SynIdentifier *memberNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(memberName);

						memberNames = memberName.end + 1;

						TypeBase *constantType = GetImportedModuleTypeAt(ctx, source, moduleCtx, constantInfo->type);

						if(!constantType)
							Stop(ctx, source, "ERROR: can't find constant %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

						ExprBase *value = NULL;

						if(constantType == ctx.typeBool)
						{
							value = new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, constantType, constantInfo->value != 0);
						}
						else if(ctx.IsIntegerType(constantType) || isType<TypeEnum>(constantType))
						{
							value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, constantType, constantInfo->value);
						}
						else if(ctx.IsFloatingPointType(constantType))
						{
							double data = 0.0;
							memcpy(&data, &constantInfo->value, sizeof(double));
							value = new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, constantType, data);
						}
							
						if(!value)
							Stop(ctx, source, "ERROR: can't import constant %d of type '%.*s'", n + 1, FMT_ISTR(constantType->name));

						structType->constants.push_back(new (ctx.get<ConstantData>()) ConstantData(memberNameIdentifier, value));

						constantInfo++;
					}

					ctx.PopScope(SCOPE_TYPE);
				}

				if(TypeClass *typeClass = getType<TypeClass>(importedType))
				{
					unsigned genericsFound = 0;

					IntrusiveList<MatchData> aliases;

					for(unsigned k = 0; k < bCode->typedefCount; k++)
					{
						ExternTypedefInfo &alias = aliasList[k];

						if(alias.parentType == delayedType.index)
						{
							InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

							SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

							TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

							if(!targetType)
								Stop(ctx, source, "ERROR: can't find type '%.*s' alias '%s' target type in module %.*s", FMT_ISTR(typeName), symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

							if(genericsFound < type.genericTypeCount)
								genericsFound++;
							else
								aliases.push_back(new (ctx.get<MatchData>()) MatchData(aliasNameIdentifier, targetType));
						}
					}

					typeClass->aliases = aliases;
				}
			}
			break;
		default:
			break;
		}
	}
}